

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

NewOrderSingle *
anon_unknown.dwarf_2926b4::createNewOrderSingle
          (NewOrderSingle *__return_storage_ptr__,char *sender,char *target,int seq)

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_350;
  FieldBase local_2f8;
  OrdType local_2a0;
  TransactTime local_248;
  Side local_1f0;
  allocator<char> local_191;
  STRING local_190;
  Symbol local_170;
  CHAR local_111;
  HandlInst local_110;
  allocator<char> local_a1;
  STRING local_a0;
  ClOrdID local_80;
  undefined1 local_25;
  int local_24;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  NewOrderSingle *newOrderSingle;
  
  local_25 = 0;
  local_24 = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"ID",&local_a1);
  FIX::ClOrdID::ClOrdID(&local_80,&local_a0);
  local_111 = '1';
  FIX::HandlInst::HandlInst(&local_110,&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"SYMBOL",&local_191);
  FIX::Symbol::Symbol(&local_170,&local_190);
  FIX::Side::Side(&local_1f0,"11ZN12_GLOBAL__N_123CATCH2_INTERNAL_TEST_434testEvE3$_2");
  FIX::TransactTime::now();
  FIX::OrdType::OrdType(&local_2a0,"1ZN12_GLOBAL__N_123CATCH2_INTERNAL_TEST_434testEvE3$_2");
  FIX42::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,&local_80,&local_110,&local_170,&local_1f0,&local_248,&local_2a0
            );
  FIX::OrdType::~OrdType(&local_2a0);
  FIX::TransactTime::~TransactTime(&local_248);
  FIX::Side::~Side(&local_1f0);
  FIX::Symbol::~Symbol(&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  FIX::HandlInst::~HandlInst(&local_110);
  FIX::ClOrdID::~ClOrdID(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,pcStack_20,local_24);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_2f8,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_2f8,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_2f8);
  this = FIX42::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_350,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_350,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_350);
  return __return_storage_ptr__;
}

Assistant:

FIX42::NewOrderSingle createNewOrderSingle(const char *sender, const char *target, int seq) {
  FIX42::NewOrderSingle newOrderSingle(
      ClOrdID("ID"),
      HandlInst('1'),
      Symbol("SYMBOL"),
      Side(Side_BUY),
      TransactTime::now(),
      OrdType(OrdType_MARKET));
  fillHeader(newOrderSingle.getHeader(), sender, target, seq);
  newOrderSingle.getHeader().setField(BodyLength(newOrderSingle.bodyLength()));
  newOrderSingle.getTrailer().setField(CheckSum(newOrderSingle.checkSum()));
  return newOrderSingle;
}